

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

proxy * __thiscall
cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
alloc<int,int,cs_impl::any::holder<bool>*>
          (allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *this,
          int *args,int *args_1,holder<bool> **args_2)

{
  long lVar1;
  __int_type_conflict _Var2;
  proxy *__p;
  new_allocator<cs_impl::any::proxy> *in_RCX;
  int *in_RDI;
  proxy *ptr;
  int *in_stack_ffffffffffffffc8;
  size_type __n;
  
  __n = 0;
  if (*(long *)(in_RDI + 0x402) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)0x0);
    if (_Var2 == 0) {
      lVar1 = *(long *)(in_RDI + 0x402);
      *(long *)(in_RDI + 0x402) = lVar1 + -1;
      __p = *(proxy **)(in_RDI + lVar1 * 2 + -2);
      goto LAB_0014d59c;
    }
  }
  __p = __gnu_cxx::new_allocator<cs_impl::any::proxy>::allocate(in_RCX,__n,in_RDI);
LAB_0014d59c:
  __gnu_cxx::new_allocator<cs_impl::any::proxy>::
  construct<cs_impl::any::proxy,int,int,cs_impl::any::holder<bool>*>
            (in_RCX,__p,in_RDI,in_stack_ffffffffffffffc8,(holder<bool> **)0x14d5c1);
  return __p;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}